

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O3

void Am_Reset_Timer_Start(Am_Object *obj,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *this;
  Am_Object *this_00;
  ostream *poVar2;
  Am_Time AStack_28;
  
  Am_Value_List::Start(&am_timing_events);
  bVar1 = Am_Value_List::Last(&am_timing_events);
  while( true ) {
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"Am_Reset_Timer_Start on ");
      poVar2 = operator<<(poVar2,obj);
      poVar2 = std::operator<<(poVar2," slot ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,slot);
      poVar2 = std::operator<<(poVar2," but hasn\'t been registered");
      std::endl<char,std::char_traits<char>>(poVar2);
      Am_Error();
    }
    this = Am_Value_List::Get(&am_timing_events);
    this_00 = (Am_Object *)Am_Value::operator_cast_to_void_(this);
    bVar1 = Am_Object::operator==(this_00,obj);
    if ((bVar1) && (*(Am_Slot_Key *)&this_00[1].data == slot)) break;
    Am_Value_List::Next(&am_timing_events);
    bVar1 = Am_Value_List::Last(&am_timing_events);
  }
  am_clock();
  Am_Time::operator=((Am_Time *)(this_00 + 4),&AStack_28);
  Am_Time::~Am_Time(&AStack_28);
  return;
}

Assistant:

void
Am_Reset_Timer_Start(Am_Object obj, Am_Slot_Key slot)
{
  Am_Interactor_Time_Event *e;
  for (am_timing_events.Start(); !am_timing_events.Last();
       am_timing_events.Next()) {
    e = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
    if (e->object == obj && e->method_slot == slot) {
      e->start_time = am_clock();
      return;
    }
  }
  Am_ERROR("Am_Reset_Timer_Start on " << obj << " slot " << slot
                                      << " but hasn't been registered")
}